

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int event_finalize_impl_(uint flags,event *ev,event_finalize_callback_fn cb)

{
  event_base *base_00;
  event_base *base;
  int r;
  event_finalize_callback_fn cb_local;
  event *ev_local;
  uint flags_local;
  
  base_00 = ev->ev_base;
  if (base_00 == (event_base *)0x0) {
    event_warnx("%s: event has no event_base set.","event_finalize_impl_");
    ev_local._4_4_ = -1;
  }
  else {
    if (base_00->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,base_00->th_base_lock);
    }
    ev_local._4_4_ = event_finalize_nolock_(base_00,flags,ev,cb);
    if (base_00->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,base_00->th_base_lock);
    }
  }
  return ev_local._4_4_;
}

Assistant:

static int
event_finalize_impl_(unsigned flags, struct event *ev, event_finalize_callback_fn cb)
{
	int r;
	struct event_base *base = ev->ev_base;
	if (EVUTIL_FAILURE_CHECK(!base)) {
		event_warnx("%s: event has no event_base set.", __func__);
		return -1;
	}

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);
	r = event_finalize_nolock_(base, flags, ev, cb);
	EVBASE_RELEASE_LOCK(base, th_base_lock);
	return r;
}